

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_bitmap_operation.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint8_t uVar7;
  imageException *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  string filePath;
  Image local_c0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint8_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"lena.bmp","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)__s);
  }
  Bitmap_Operation::Load(&local_c0,&local_50);
  if (local_c0._data != (uchar *)0x0) {
    if (local_c0._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)local_98,&local_c0);
      uVar7 = local_78;
      uVar6 = local_88._M_allocated_capacity._4_4_;
      uVar4 = local_98._8_8_;
      puVar3 = local_c0._data;
      uVar1 = local_c0._16_2_;
      local_98._8_4_ = local_c0._width;
      local_98._12_4_ = local_c0._height;
      uVar5 = local_98._8_8_;
      local_98._8_4_ = (undefined4)uVar4;
      local_98._12_4_ = SUB84(uVar4,4);
      local_c0._width = local_98._8_4_;
      local_c0._height = local_98._12_4_;
      local_c0._colorCount = local_88._M_local_buf[0];
      local_c0._alignment = local_88._M_local_buf[1];
      uVar2 = local_c0._16_2_;
      local_c0._colorCount = (uint8_t)uVar1;
      local_c0._alignment = SUB21(uVar1,1);
      local_88._M_local_buf[0] = local_c0._colorCount;
      local_88._M_local_buf[1] = local_c0._alignment;
      local_88._M_allocated_capacity._4_4_ = local_c0._rowSize;
      local_c0._rowSize = uVar6;
      local_c0._data = (uchar *)local_88._8_8_;
      local_88._8_8_ = puVar3;
      local_78 = local_c0._type;
      local_c0._type = uVar7;
      local_98._0_8_ = &PTR__ImageTemplate_0011ac30;
      local_c0._16_2_ = uVar2;
      local_98._8_8_ = uVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_98);
    }
    Image_Function::Histogram
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,&local_c0);
    uVar7 = Image_Function::GetThreshold
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
    Image_Function::Threshold((Image *)local_98,&local_c0,uVar7);
    uVar7 = local_78;
    uVar6 = local_88._M_allocated_capacity._4_4_;
    uVar4 = local_98._8_8_;
    puVar3 = local_c0._data;
    uVar1 = local_c0._16_2_;
    local_98._8_4_ = local_c0._width;
    local_98._12_4_ = local_c0._height;
    uVar5 = local_98._8_8_;
    local_98._8_4_ = (undefined4)uVar4;
    local_98._12_4_ = SUB84(uVar4,4);
    local_c0._width = local_98._8_4_;
    local_c0._height = local_98._12_4_;
    local_c0._colorCount = local_88._M_local_buf[0];
    local_c0._alignment = local_88._M_local_buf[1];
    uVar2 = local_c0._16_2_;
    local_c0._colorCount = (uint8_t)uVar1;
    local_c0._alignment = SUB21(uVar1,1);
    local_88._M_local_buf[0] = local_c0._colorCount;
    local_88._M_local_buf[1] = local_c0._alignment;
    local_88._M_allocated_capacity._4_4_ = local_c0._rowSize;
    local_c0._rowSize = uVar6;
    local_c0._data = (uchar *)local_88._8_8_;
    local_88._8_8_ = puVar3;
    local_78 = local_c0._type;
    local_98._0_8_ = &PTR__ImageTemplate_0011ac30;
    local_c0._type = uVar7;
    local_c0._16_2_ = uVar2;
    local_98._8_8_ = uVar5;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_98);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"result.bmp","");
    Bitmap_Operation::Save((string *)local_98,&local_c0);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_);
    }
    if (local_70._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_c0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Application ended correctly.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Cannot load ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_70,&local_50);
  imageException::imageException(this,(string *)local_98);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "lena.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load an image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Save result
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}